

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_replace(REF_CAVITY ref_cavity)

{
  REF_CAVITY_STATE RVar1;
  int iVar2;
  REF_GRID pRVar3;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_INT *pRVar4;
  REF_ADJ pRVar5;
  REF_ADJ_ITEM pRVar6;
  uint uVar7;
  REF_STATUS RVar8;
  uint uVar9;
  long lVar10;
  REF_LIST pRVar11;
  long lVar12;
  undefined8 uVar13;
  ulong unaff_RBP;
  REF_INT node;
  REF_CELL pRVar14;
  char *pcVar15;
  long lVar16;
  REF_CELL *ppRVar17;
  ulong uVar18;
  REF_LIST ref_list;
  REF_INT new_cell;
  REF_INT nodes [27];
  REF_DBL volume;
  REF_INT local_d4;
  REF_CELL local_d0;
  long local_c8;
  REF_LIST local_c0;
  long local_b8;
  REF_INT local_ac;
  uint local_a8 [28];
  double local_38;
  
  pRVar3 = ref_cavity->ref_grid;
  ref_node = pRVar3->node;
  ref_geom = pRVar3->geom;
  if (ref_cavity->debug != 0) {
    uVar7 = ref_cavity_tec(ref_cavity,"ref_cavity_replace.tec");
    unaff_RBP = (ulong)uVar7;
    if (uVar7 != 0) {
      pcVar15 = "tec for replace fail";
      uVar13 = 0x280;
      goto LAB_001ef910;
    }
  }
  RVar1 = ref_cavity->state;
  if ((ulong)RVar1 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x283,
           "ref_cavity_replace","attempt to replace cavity that is not visible",1,(ulong)RVar1);
    unaff_RBP = 1;
  }
  if (RVar1 != REF_CAVITY_VISIBLE) {
    return (REF_STATUS)unaff_RBP;
  }
  uVar7 = ref_cavity_verify_face_manifold(ref_cavity);
  if (uVar7 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x285,
           "ref_cavity_replace",(ulong)uVar7,"replace face manifold");
    unaff_RBP = (ulong)uVar7;
  }
  if (uVar7 != 0) {
    return (REF_STATUS)unaff_RBP;
  }
  RVar8 = ref_cavity_verify_seg_manifold(ref_cavity);
  if (RVar8 != 0) {
    unaff_RBP = 1;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x286,
           "ref_cavity_replace",1,"replace seg manifold");
  }
  if (RVar8 != 0) {
    return (REF_STATUS)unaff_RBP;
  }
  RVar1 = ref_cavity->state;
  if ((ulong)RVar1 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x289,
           "ref_cavity_replace","attempt to replace cavity that is inconsistent",1,(ulong)RVar1);
    unaff_RBP = 1;
  }
  if (RVar1 != REF_CAVITY_VISIBLE) {
    return (REF_STATUS)unaff_RBP;
  }
  if ((((ref_cavity->nseg == 0) && (ref_cavity->nface == 0)) && (ref_cavity->tri_list->n == 0)) &&
     (ref_cavity->tet_list->n == 0)) {
    pcVar15 = "attempt noop";
    uVar13 = 0x28e;
LAB_001f082f:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar13
           ,"ref_cavity_replace",pcVar15);
    return 1;
  }
  if (0 < ref_cavity->maxface) {
    uVar7 = ref_cavity->node;
    pRVar14 = ref_cavity->ref_grid->cell[8];
    lVar16 = 0;
    do {
      pRVar4 = ref_cavity->f2n;
      uVar9 = pRVar4[lVar16 * 3];
      if (uVar9 != 0xffffffff) {
        local_a8[0] = uVar9;
        local_a8[1] = pRVar4[lVar16 * 3 + 1];
        local_a8[2] = pRVar4[lVar16 * 3 + 2];
        local_a8[3] = uVar7;
        if (((uVar7 != uVar9) && (uVar7 != pRVar4[lVar16 * 3 + 1])) &&
           (uVar7 != pRVar4[lVar16 * 3 + 2])) {
          lVar10 = 0;
          do {
            lVar12 = (long)(int)local_a8[lVar10];
            if (((lVar12 < 0) || (ref_node->max <= (int)local_a8[lVar10])) ||
               (ref_node->global[lVar12] < 0)) {
              pcVar15 = "cavity tet nodes not valid";
              uVar13 = 0x29a;
              goto LAB_001f082f;
            }
            if (ref_node->ref_mpi->id != ref_node->part[lVar12]) {
              pcVar15 = "cavity tet nodes not local";
              uVar13 = 0x29b;
              goto LAB_001f082f;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar7);
          local_d0 = pRVar14;
          uVar7 = ref_cell_add(pRVar14,(REF_INT *)local_a8,&local_d4);
          if (uVar7 != 0) {
            unaff_RBP = (ulong)uVar7;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x29d,"ref_cavity_replace",(ulong)uVar7,"add");
          }
          if (uVar7 != 0) {
            return (REF_STATUS)unaff_RBP;
          }
          uVar7 = ref_node_tet_vol(ref_node,(REF_INT *)local_a8,&local_38);
          if (uVar7 != 0) {
            unaff_RBP = (ulong)uVar7;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x29e,"ref_cavity_replace",(ulong)uVar7,"norm");
          }
          if (uVar7 != 0) {
            return (REF_STATUS)unaff_RBP;
          }
          if (local_38 <= ref_node->min_volume) {
            printf("%d %d %d %d %e\n",(ulong)local_a8[0],(ulong)local_a8[1],(ulong)local_a8[2],
                   (ulong)local_a8[3]);
          }
          pRVar14 = local_d0;
          uVar7 = (uint)local_c8;
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < ref_cavity->maxface);
  }
  uVar7 = ref_cavity->surf_node;
  if (uVar7 == 0xffffffff) {
    uVar7 = ref_cavity->node;
  }
  if (0 < ref_cavity->maxseg) {
    pRVar14 = ref_cavity->ref_grid->cell[3];
    lVar16 = 0;
    do {
      pRVar4 = ref_cavity->s2n;
      uVar9 = pRVar4[lVar16 * 3];
      if (uVar9 != 0xffffffff) {
        local_a8[0] = uVar9;
        local_a8[1] = pRVar4[lVar16 * 3 + 1];
        local_a8[2] = uVar7;
        local_a8[3] = pRVar4[lVar16 * 3 + 2];
        if (uVar7 != pRVar4[lVar16 * 3 + 1] && uVar7 != uVar9) {
          lVar10 = 0;
          do {
            lVar12 = (long)(int)local_a8[lVar10];
            if (((lVar12 < 0) || (ref_node->max <= (int)local_a8[lVar10])) ||
               (ref_node->global[lVar12] < 0)) {
              pcVar15 = "cavity tri nodes not valid";
              uVar13 = 0x2ad;
              goto LAB_001f082f;
            }
            if (ref_node->ref_mpi->id != ref_node->part[lVar12]) {
              pcVar15 = "cavity tri nodes not local";
              uVar13 = 0x2ae;
              goto LAB_001f082f;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_c8 = CONCAT44(local_c8._4_4_,uVar7);
          local_d0 = pRVar14;
          uVar9 = ref_cell_add(pRVar14,(REF_INT *)local_a8,&local_d4);
          if (uVar9 != 0) {
            unaff_RBP = (ulong)uVar9;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x2b0,"ref_cavity_replace",(ulong)uVar9,"add");
          }
          pRVar14 = local_d0;
          uVar7 = (uint)local_c8;
          if (uVar9 != 0) {
            return (REF_STATUS)unaff_RBP;
          }
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < ref_cavity->maxseg);
  }
  uVar7 = ref_list_create(&local_c0);
  if (uVar7 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x2b4,
           "ref_cavity_replace",(ulong)uVar7,"create removed node list");
    unaff_RBP = (ulong)uVar7;
  }
  if (uVar7 != 0) {
    return (REF_STATUS)unaff_RBP;
  }
  pRVar11 = ref_cavity->tet_list;
  if (0 < pRVar11->n) {
    local_d0 = ref_cavity->ref_grid->cell[8];
    lVar16 = 0;
    do {
      local_d4 = pRVar11->value[lVar16];
      local_b8 = lVar16;
      uVar7 = ref_cell_nodes(local_d0,local_d4,(REF_INT *)local_a8);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x2b9,"ref_cavity_replace",(ulong)uVar7,"rm");
        unaff_RBP = (ulong)uVar7;
      }
      if (uVar7 != 0) {
        return (REF_STATUS)unaff_RBP;
      }
      lVar16 = 0;
      do {
        local_c8 = lVar16;
        uVar7 = ref_list_push(local_c0,local_a8[lVar16]);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 699,"ref_cavity_replace",(ulong)uVar7,"tet list");
          unaff_RBP = (ulong)uVar7;
        }
        if (uVar7 != 0) {
          return (REF_STATUS)unaff_RBP;
        }
        lVar16 = (long)(int)local_a8[local_c8];
        if (((lVar16 < 0) || (ref_node->max <= (int)local_a8[local_c8])) ||
           (ref_node->global[lVar16] < 0)) {
          pcVar15 = "cavity rm tet nodes not valid";
          uVar13 = 700;
          goto LAB_001f082f;
        }
        if (ref_node->ref_mpi->id != ref_node->part[lVar16]) {
          pcVar15 = "cavity rm tet nodes not local";
          uVar13 = 0x2bd;
          goto LAB_001f082f;
        }
        lVar16 = local_c8 + 1;
      } while (lVar16 != 4);
      uVar7 = ref_cell_remove(local_d0,local_d4);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x2bf,"ref_cavity_replace",(ulong)uVar7,"rm tet");
        unaff_RBP = (ulong)uVar7;
      }
      if (uVar7 != 0) {
        return (REF_STATUS)unaff_RBP;
      }
      lVar16 = local_b8 + 1;
      pRVar11 = ref_cavity->tet_list;
    } while (lVar16 < pRVar11->n);
  }
  pRVar11 = ref_cavity->tri_list;
  if (0 < pRVar11->n) {
    local_d0 = ref_cavity->ref_grid->cell[3];
    lVar16 = 0;
    do {
      local_d4 = pRVar11->value[lVar16];
      local_b8 = lVar16;
      uVar7 = ref_cell_nodes(local_d0,local_d4,(REF_INT *)local_a8);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x2c5,"ref_cavity_replace",(ulong)uVar7,"rm");
        unaff_RBP = (ulong)uVar7;
      }
      if (uVar7 != 0) {
        return (REF_STATUS)unaff_RBP;
      }
      lVar16 = 0;
      do {
        local_c8 = lVar16;
        uVar7 = ref_list_push(local_c0,local_a8[lVar16]);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x2c7,"ref_cavity_replace",(ulong)uVar7,"tri list");
          unaff_RBP = (ulong)uVar7;
        }
        if (uVar7 != 0) {
          return (REF_STATUS)unaff_RBP;
        }
        lVar16 = (long)(int)local_a8[local_c8];
        if (((lVar16 < 0) || (ref_node->max <= (int)local_a8[local_c8])) ||
           (ref_node->global[lVar16] < 0)) {
          pcVar15 = "cavity rm tri nodes not valid";
          uVar13 = 0x2c8;
          goto LAB_001f082f;
        }
        if (ref_node->ref_mpi->id != ref_node->part[lVar16]) {
          pcVar15 = "cavity rm tri nodes not local";
          uVar13 = 0x2c9;
          goto LAB_001f082f;
        }
        lVar16 = local_c8 + 1;
      } while (lVar16 != 3);
      uVar7 = ref_cell_remove(local_d0,local_d4);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x2cb,"ref_cavity_replace",(ulong)uVar7,"rm tri");
        unaff_RBP = (ulong)uVar7;
      }
      if (uVar7 != 0) {
        return (REF_STATUS)unaff_RBP;
      }
      lVar16 = local_b8 + 1;
      pRVar11 = ref_cavity->tri_list;
    } while (lVar16 < pRVar11->n);
  }
  if (0 < local_c0->n) {
    lVar16 = 0;
    do {
      iVar2 = local_c0->value[lVar16];
      lVar10 = (long)iVar2;
      if (((-1 < lVar10) && (iVar2 < ref_node->max)) && (-1 < ref_node->global[lVar10])) {
        pRVar5 = pRVar3->cell[3]->ref_adj;
        if ((pRVar5->nnode <= iVar2) || (pRVar5->first[lVar10] == -1)) {
          local_c8 = lVar10;
          uVar7 = ref_geom_remove_all(ref_geom,iVar2);
          if (uVar7 != 0) {
            unaff_RBP = (ulong)uVar7;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x2d2,"ref_cavity_replace",(ulong)uVar7,"remove geom");
          }
          lVar10 = local_c8;
          if (uVar7 != 0) {
            return (REF_STATUS)unaff_RBP;
          }
        }
        pRVar5 = pRVar3->cell[3]->ref_adj;
        node = (REF_INT)lVar10;
        if (((pRVar5->nnode <= node) || (pRVar5->first[lVar10] == -1)) &&
           ((pRVar5 = pRVar3->cell[8]->ref_adj, pRVar5->nnode <= node ||
            (pRVar5->first[lVar10] == -1)))) {
          uVar7 = ref_node_remove(ref_node,node);
          if (uVar7 != 0) {
            unaff_RBP = (ulong)uVar7;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x2d6,"ref_cavity_replace",(ulong)uVar7,"remove node");
          }
          if (uVar7 != 0) {
            return (REF_STATUS)unaff_RBP;
          }
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < local_c0->n);
  }
  if ((ref_cavity->split_node0 != 0xffffffff) && (ref_cavity->split_node1 != 0xffffffff)) {
    pRVar14 = ref_cavity->ref_grid->cell[0];
    local_a8[0] = ref_cavity->split_node0;
    local_a8[1] = ref_cavity->split_node1;
    uVar7 = ref_cell_with(pRVar14,(REF_INT *)local_a8,&local_d4);
    if ((uVar7 != 0) && (uVar7 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x2e0,"ref_cavity_replace",(ulong)uVar7,"find edg");
      unaff_RBP = (ulong)uVar7;
    }
    if ((uVar7 != 5) && (uVar7 != 0)) {
      return (REF_STATUS)unaff_RBP;
    }
    if (local_d4 != -1) {
      uVar7 = ref_cell_nodes(pRVar14,local_d4,(REF_INT *)local_a8);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x2e2,"ref_cavity_replace",(ulong)uVar7,"cell nodes");
        unaff_RBP = (ulong)uVar7;
      }
      if (uVar7 != 0) {
        return (REF_STATUS)unaff_RBP;
      }
      uVar7 = ref_cell_remove(pRVar14,local_d4);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x2e3,"ref_cavity_replace",(ulong)uVar7,"remove");
        unaff_RBP = (ulong)uVar7;
      }
      if (uVar7 != 0) {
        return (REF_STATUS)unaff_RBP;
      }
      local_a8[0] = ref_cavity->split_node0;
      local_a8[1] = ref_cavity->surf_node;
      if (local_a8[1] == -1) {
        local_a8[1] = ref_cavity->node;
      }
      uVar7 = ref_cell_add(pRVar14,(REF_INT *)local_a8,&local_ac);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x2e6,"ref_cavity_replace",(ulong)uVar7,"add node0 version");
        unaff_RBP = (ulong)uVar7;
      }
      if (uVar7 != 0) {
        return (REF_STATUS)unaff_RBP;
      }
      local_a8[0] = ref_cavity->surf_node;
      if (local_a8[0] == 0xffffffff) {
        local_a8[0] = ref_cavity->node;
      }
      local_a8[1] = ref_cavity->split_node1;
      uVar7 = ref_cell_add(pRVar14,(REF_INT *)local_a8,&local_ac);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x2e9,"ref_cavity_replace",(ulong)uVar7,"add node1 version");
        unaff_RBP = (ulong)uVar7;
      }
      if (uVar7 != 0) {
        return (REF_STATUS)unaff_RBP;
      }
    }
  }
  if ((ref_cavity->collapse_node0 != 0xffffffff) && (ref_cavity->collapse_node1 != 0xffffffff)) {
    pRVar14 = ref_cavity->ref_grid->cell[0];
    local_a8[0] = ref_cavity->collapse_node0;
    local_a8[1] = ref_cavity->collapse_node1;
    uVar7 = ref_cell_with(pRVar14,(REF_INT *)local_a8,&local_d4);
    if ((uVar7 != 0) && (uVar7 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x2f2,"ref_cavity_replace",(ulong)uVar7,"find edg");
      unaff_RBP = (ulong)uVar7;
    }
    if ((uVar7 != 5) && (uVar7 != 0)) {
      return (REF_STATUS)unaff_RBP;
    }
    if (local_d4 != -1) {
      uVar7 = ref_cell_nodes(pRVar14,local_d4,(REF_INT *)local_a8);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x2f4,"ref_cavity_replace",(ulong)uVar7,"cell nodes");
        unaff_RBP = (ulong)uVar7;
      }
      if (uVar7 != 0) {
        return (REF_STATUS)unaff_RBP;
      }
      uVar7 = ref_cell_remove(pRVar14,local_d4);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x2f5,"ref_cavity_replace",(ulong)uVar7,"remove");
        unaff_RBP = (ulong)uVar7;
      }
      if (uVar7 != 0) {
        return (REF_STATUS)unaff_RBP;
      }
      uVar7 = ref_cell_replace_node(pRVar14,ref_cavity->collapse_node1,ref_cavity->collapse_node0);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x2f8,"ref_cavity_replace",(ulong)uVar7,"replace node");
        unaff_RBP = (ulong)uVar7;
      }
      if (uVar7 != 0) {
        return (REF_STATUS)unaff_RBP;
      }
    }
  }
  iVar2 = ref_cavity->node;
  pRVar14 = ref_cavity->ref_grid->cell[8];
  local_d4 = -1;
  uVar18 = 0xffffffff;
  if (-1 < (long)iVar2) {
    uVar18 = 0xffffffff;
    if (iVar2 < pRVar14->ref_adj->nnode) {
      uVar18 = (ulong)(uint)pRVar14->ref_adj->first[iVar2];
    }
  }
  if ((int)uVar18 != -1) {
    local_d4 = pRVar14->ref_adj->item[(int)uVar18].ref;
    do {
      uVar7 = ref_cell_nodes(pRVar14,local_d4,(REF_INT *)local_a8);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x300,"ref_cavity_replace",(ulong)uVar7,"");
        unaff_RBP = (ulong)uVar7;
      }
      if (uVar7 != 0) {
        return (REF_STATUS)unaff_RBP;
      }
      lVar16 = 0;
      do {
        uVar7 = local_a8[lVar16];
        if ((((long)(int)uVar7 < 0) || (ref_node->max <= (int)uVar7)) ||
           (ref_node->global[(int)uVar7] < 0)) {
          pcVar15 = "cavity replaced tet nodes not valid";
          uVar13 = 0x303;
          goto LAB_001f082f;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      pRVar6 = pRVar14->ref_adj->item;
      iVar2 = pRVar6[(int)uVar18].next;
      uVar18 = (ulong)iVar2;
      if (uVar18 == 0xffffffffffffffff) {
        local_d4 = -1;
      }
      else {
        local_d4 = pRVar6[uVar18].ref;
      }
    } while (iVar2 != -1);
  }
  if ((pRVar3->twod == 0) && (pRVar3->surf == 0)) {
    ppRVar17 = pRVar3->cell + 8;
  }
  else {
    ppRVar17 = pRVar3->cell + 3;
  }
  if (0 < (long)local_c0->n) {
    lVar16 = 0;
    do {
      iVar2 = local_c0->value[lVar16];
      lVar10 = (long)iVar2;
      if (((-1 < lVar10) && (iVar2 < ref_node->max)) &&
         ((-1 < ref_node->global[lVar10] &&
          (((*ppRVar17)->ref_adj->nnode <= iVar2 || ((*ppRVar17)->ref_adj->first[lVar10] == -1))))))
      {
        pcVar15 = "element missing for valid node";
        uVar13 = 0x30f;
        goto LAB_001f082f;
      }
      lVar16 = lVar16 + 1;
    } while (local_c0->n != lVar16);
  }
  uVar7 = ref_list_free(local_c0);
  if (uVar7 == 0) {
    return 0;
  }
  unaff_RBP = (ulong)uVar7;
  pcVar15 = "list free";
  uVar13 = 0x313;
LAB_001ef910:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar13,
         "ref_cavity_replace",unaff_RBP,pcVar15);
  return (REF_STATUS)unaff_RBP;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_replace(REF_CAVITY ref_cavity) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_INT face, seg;
  REF_INT cell, new_cell;
  REF_INT i, item;
  REF_DBL volume;
  REF_LIST ref_list;

  if (ref_cavity_debug(ref_cavity))
    RSS(ref_cavity_tec(ref_cavity, "ref_cavity_replace.tec"),
        "tec for replace fail");

  REIS(REF_CAVITY_VISIBLE, ref_cavity_state(ref_cavity),
       "attempt to replace cavity that is not visible");

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "replace face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "replace seg manifold");

  REIS(REF_CAVITY_VISIBLE, ref_cavity_state(ref_cavity),
       "attempt to replace cavity that is inconsistent");

  if (0 == ref_cavity_nseg(ref_cavity) && 0 == ref_cavity_nface(ref_cavity) &&
      0 == ref_list_n(ref_cavity_tri_list(ref_cavity)) &&
      0 == ref_list_n(ref_cavity_tet_list(ref_cavity))) {
    THROW("attempt noop");
  }
  node = ref_cavity_node(ref_cavity);
  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_face(ref_cavity, face) {
    nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
    nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
    nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
    nodes[3] = node;
    if (node == nodes[0] || node == nodes[1] || node == nodes[2])
      continue; /* attached face */
    for (i = 0; i < 4; i++) {
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity tet nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity tet nodes not local");
    }
    RSS(ref_cell_add(ref_cell, nodes, &cell), "add");
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "norm");
    if (volume <= ref_node_min_volume(ref_node))
      printf("%d %d %d %d %e\n", nodes[0], nodes[1], nodes[2], nodes[3],
             volume);
  }

  node = ref_cavity_seg_node(ref_cavity);
  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    nodes[0] = ref_cavity_s2n(ref_cavity, 0, seg);
    nodes[1] = ref_cavity_s2n(ref_cavity, 1, seg);
    nodes[2] = node;
    nodes[3] = ref_cavity_s2n(ref_cavity, 2, seg);
    if (node == nodes[0] || node == nodes[1]) continue; /* attached seg */
    for (i = 0; i < 3; i++) {
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity tri nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity tri nodes not local");
    }
    RSS(ref_cell_add(ref_cell, nodes, &cell), "add");
    /* check validity, area? */
  }

  RSS(ref_list_create(&ref_list), "create removed node list");

  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "rm");
    for (i = 0; i < 4; i++) {
      RSS(ref_list_push(ref_list, nodes[i]), "tet list");
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity rm tet nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity rm tet nodes not local");
    }
    RSS(ref_cell_remove(ref_cell, cell), "rm tet");
  }

  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "rm");
    for (i = 0; i < 3; i++) {
      RSS(ref_list_push(ref_list, nodes[i]), "tri list");
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity rm tri nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity rm tri nodes not local");
    }
    RSS(ref_cell_remove(ref_cell, cell), "rm tri");
  }

  each_ref_list_item(ref_list, item) {
    node = ref_list_value(ref_list, item);
    if (ref_node_valid(ref_node, node)) {
      if (ref_cell_node_empty(ref_grid_tri(ref_grid), node)) {
        RSS(ref_geom_remove_all(ref_geom, node), "remove geom");
      }
      if (ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
          ref_cell_node_empty(ref_grid_tet(ref_grid), node)) {
        RSS(ref_node_remove(ref_node, node), "remove node");
      }
    }
  }

  if (ref_cavity->split_node0 != REF_EMPTY &&
      ref_cavity->split_node1 != REF_EMPTY) {
    nodes[0] = ref_cavity->split_node0;
    nodes[1] = ref_cavity->split_node1;
    ref_cell = ref_grid_edg(ref_cavity_grid(ref_cavity));
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find edg");
    if (REF_EMPTY != cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_cell_remove(ref_cell, cell), "remove");
      nodes[0] = ref_cavity->split_node0;
      nodes[1] = ref_cavity_seg_node(ref_cavity);
      RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
      nodes[0] = ref_cavity_seg_node(ref_cavity);
      nodes[1] = ref_cavity->split_node1;
      RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    }
  }

  if (ref_cavity->collapse_node0 != REF_EMPTY &&
      ref_cavity->collapse_node1 != REF_EMPTY) {
    nodes[0] = ref_cavity->collapse_node0;
    nodes[1] = ref_cavity->collapse_node1;
    ref_cell = ref_grid_edg(ref_cavity_grid(ref_cavity));
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find edg");
    if (REF_EMPTY != cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_cell_remove(ref_cell, cell), "remove");
      RSS(ref_cell_replace_node(ref_cell, ref_cavity->collapse_node1,
                                ref_cavity->collapse_node0),
          "replace node");
    }
  }

  /* self check to catch invalid node early */
  node = ref_cavity_node(ref_cavity);
  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "");
    for (i = 0; i < 4; i++) {
      RAS(ref_node_valid(ref_node, nodes[i]),
          "cavity replaced tet nodes not valid");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid))
    ref_cell = ref_grid_tri(ref_grid);

  each_ref_list_item(ref_list, item) {
    node = ref_list_value(ref_list, item);
    if (ref_node_valid(ref_node, node)) {
      RAS(!ref_cell_node_empty(ref_cell, node),
          "element missing for valid node");
    }
  }

  RSS(ref_list_free(ref_list), "list free");

  return REF_SUCCESS;
}